

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode NodeId_copy(UA_NodeId *src,UA_NodeId *dst,UA_DataType *_)

{
  undefined2 uVar1;
  UA_NodeIdType UVar2;
  UA_StatusCode local_2c;
  UA_StatusCode retval;
  UA_DataType *__local;
  UA_NodeId *dst_local;
  UA_NodeId *src_local;
  
  switch(src->identifierType) {
  case UA_NODEIDTYPE_NUMERIC:
    uVar1 = *(undefined2 *)&src->field_0x2;
    UVar2 = src->identifierType;
    dst->namespaceIndex = src->namespaceIndex;
    *(undefined2 *)&dst->field_0x2 = uVar1;
    dst->identifierType = UVar2;
    (dst->identifier).string.length = (src->identifier).string.length;
    (dst->identifier).string.data = (src->identifier).string.data;
    return 0;
  default:
    return 0x80020000;
  case UA_NODEIDTYPE_STRING:
    local_2c = UA_String_copy(&(src->identifier).string,&(dst->identifier).string);
    break;
  case UA_NODEIDTYPE_GUID:
    local_2c = UA_Guid_copy(&(src->identifier).guid,&(dst->identifier).guid);
    break;
  case UA_NODEIDTYPE_BYTESTRING:
    local_2c = UA_ByteString_copy(&(src->identifier).byteString,&(dst->identifier).byteString);
  }
  dst->namespaceIndex = src->namespaceIndex;
  dst->identifierType = src->identifierType;
  return local_2c;
}

Assistant:

static UA_StatusCode
NodeId_copy(UA_NodeId const *src, UA_NodeId *dst, const UA_DataType *_) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(src->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        *dst = *src;
        return UA_STATUSCODE_GOOD;
    case UA_NODEIDTYPE_STRING:
        retval |= UA_String_copy(&src->identifier.string,
                                 &dst->identifier.string);
        break;
    case UA_NODEIDTYPE_GUID:
        retval |= UA_Guid_copy(&src->identifier.guid, &dst->identifier.guid);
        break;
    case UA_NODEIDTYPE_BYTESTRING:
        retval |= UA_ByteString_copy(&src->identifier.byteString,
                                     &dst->identifier.byteString);
        break;
    default:
        return UA_STATUSCODE_BADINTERNALERROR;
    }
    dst->namespaceIndex = src->namespaceIndex;
    dst->identifierType = src->identifierType;
    return retval;
}